

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void ImportModule(ExpressionContext *ctx,SynBase *source,ByteCode *bytecode,Lexeme *lexStream,
                 uint lexStreamSize,InplaceStr name)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  ModuleData **ppMVar3;
  Lexer *this;
  Lexeme *lexStart;
  ModuleData *moduleData;
  uint local_284;
  Lexeme *local_280;
  TraceScope traceScope;
  undefined1 local_268 [8];
  char *pcStack_260;
  ModuleData *local_258 [32];
  Allocator *local_158;
  TypeBase **local_150;
  undefined8 local_148;
  TypeBase *local_140 [32];
  Allocator *local_40;
  ModuleData *local_38;
  undefined4 extraout_var_00;
  
  local_284 = lexStreamSize;
  local_280 = lexStream;
  if (ImportModule(ExpressionContext&,SynBase*,ByteCode*,Lexeme*,unsigned_int,InplaceStr)::token ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&ImportModule(ExpressionContext&,SynBase*,ByteCode*,Lexeme*,unsigned_int,InplaceStr)
                                 ::token);
    if (iVar1 != 0) {
      ImportModule::token = NULLC::TraceGetToken("analyze","ImportModule");
      __cxa_guard_release(&ImportModule(ExpressionContext&,SynBase*,ByteCode*,Lexeme*,unsigned_int,InplaceStr)
                           ::token);
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope,ImportModule::token);
  if (bytecode == (ByteCode *)0x0) {
    __assert_fail("bytecode",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x33ac,
                  "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
                 );
  }
  if (*name.end != '\0') {
    __assert_fail("*name.end == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x33ae,
                  "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
                 );
  }
  pcVar2 = strstr(name.begin,".nc");
  if (pcVar2 != (char *)0x0) {
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    moduleData = (ModuleData *)CONCAT44(extraout_var,iVar1);
    moduleData->source = source;
    (moduleData->name).begin = name.begin;
    (moduleData->name).end = name.end;
    moduleData->importIndex = 0;
    moduleData->bytecode = (ByteCode *)0x0;
    moduleData->lexer = (Lexer *)0x0;
    moduleData->importedFunctionCount = 0;
    moduleData->moduleFunctionCount = 0;
    moduleData->lexStream = (Lexeme *)0x0;
    moduleData->lexStreamSize = 0;
    moduleData->startingFunctionIndex = 0;
    SmallArray<ModuleData_*,_128U>::push_back(&ctx->imports,&moduleData);
    moduleData->importIndex = (ctx->imports).count;
    local_268 = (undefined1  [8])name.begin;
    pcStack_260 = name.end;
    ppMVar3 = SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::find
                        (&ctx->uniqueDependencyMap,(InplaceStr *)local_268);
    if (ppMVar3 == (ModuleData **)0x0) {
      SmallArray<ModuleData_*,_128U>::push_back(&ctx->uniqueDependencies,&moduleData);
    }
    moduleData->bytecode = bytecode;
    lexStart = local_280;
    if (local_280 == (Lexeme *)0x0) {
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x420);
      this = (Lexer *)CONCAT44(extraout_var_00,iVar1);
      Lexer::Lexer(this,ctx->allocator);
      moduleData->lexer = this;
      pcVar2 = FindSource(bytecode);
      Lexer::Lexify(this,pcVar2);
      lexStart = Lexer::GetStreamStart(moduleData->lexer);
      local_284 = Lexer::GetStreamSize(moduleData->lexer);
      if (*name.end != '\0') {
        __assert_fail("!*name.end",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x33c3,
                      "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
                     );
      }
      BinaryCache::PutLexemes(name.begin,lexStart,local_284);
      bytecode = moduleData->bytecode;
    }
    moduleData->lexStream = lexStart;
    moduleData->lexStreamSize = local_284;
    moduleData->startingFunctionIndex = (ctx->functions).count;
    local_158 = ctx->allocator;
    local_268 = (undefined1  [8])local_258;
    pcStack_260 = (char *)0x2000000000;
    local_150 = local_140;
    local_148._0_4_ = 0;
    local_148._4_4_ = 0x20;
    local_38 = moduleData;
    local_40 = local_158;
    ImportModuleDependencies(ctx,source,(ModuleContext *)local_268,bytecode);
    ImportModuleNamespaces(ctx,source,(ModuleContext *)local_268);
    ImportModuleTypes(ctx,source,(ModuleContext *)local_268);
    ImportModuleVariables(ctx,source,(ModuleContext *)local_268);
    ImportModuleTypedefs(ctx,source,(ModuleContext *)local_268);
    ImportModuleFunctions(ctx,source,(ModuleContext *)local_268);
    moduleData->moduleFunctionCount = (ctx->functions).count - moduleData->startingFunctionIndex;
    ModuleContext::~ModuleContext((ModuleContext *)local_268);
    NULLC::TraceScope::~TraceScope(&traceScope);
    return;
  }
  __assert_fail("strstr(name.begin, \".nc\") != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x33af,
                "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
               );
}

Assistant:

void ImportModule(ExpressionContext &ctx, SynBase *source, ByteCode* bytecode, Lexeme *lexStream, unsigned lexStreamSize, InplaceStr name)
{
	TRACE_SCOPE("analyze", "ImportModule");

	assert(bytecode);

	assert(*name.end == 0);
	assert(strstr(name.begin, ".nc") != 0);

	ModuleData *moduleData = new (ctx.get<ModuleData>()) ModuleData(source, name);

	ctx.imports.push_back(moduleData);
	moduleData->importIndex = ctx.imports.size();

	if(!ctx.uniqueDependencyMap.find(InplaceStr(name)))
		ctx.uniqueDependencies.push_back(moduleData);

	moduleData->bytecode = bytecode;

	if(!lexStream)
	{
		moduleData->lexer = new (ctx.get<Lexer>()) Lexer(ctx.allocator);

		moduleData->lexer->Lexify(FindSource(bytecode));
		lexStream = moduleData->lexer->GetStreamStart();
		lexStreamSize = moduleData->lexer->GetStreamSize();

		assert(!*name.end);

		BinaryCache::PutLexemes(name.begin, lexStream, lexStreamSize);
	}

	moduleData->lexStream = lexStream;
	moduleData->lexStreamSize = lexStreamSize;

	moduleData->startingFunctionIndex = ctx.functions.size();

	ModuleContext moduleCtx(ctx.allocator);

	moduleCtx.data = moduleData;

	ImportModuleDependencies(ctx, source, moduleCtx, moduleData->bytecode);

	ImportModuleNamespaces(ctx, source, moduleCtx);

	ImportModuleTypes(ctx, source, moduleCtx);

	ImportModuleVariables(ctx, source, moduleCtx);

	ImportModuleTypedefs(ctx, source, moduleCtx);

	ImportModuleFunctions(ctx, source, moduleCtx);

	moduleData->moduleFunctionCount = ctx.functions.size() - moduleData->startingFunctionIndex;
}